

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O0

void Abc_SclUpsizePrintDiffs(SC_Man *p,SC_Lib *pLib,Abc_Ntk_t *pNtk)

{
  int iVar1;
  void *__dest;
  void *__dest_00;
  void *__dest_01;
  Abc_Obj_t *pObj_00;
  float fVar2;
  SC_Pair *pLoads;
  SC_Pair *pSlews;
  SC_Pair *pTimes;
  Abc_Obj_t *pObj;
  int k;
  float fDiff;
  Abc_Ntk_t *pNtk_local;
  SC_Lib *pLib_local;
  SC_Man *p_local;
  
  __dest = malloc((long)p->nObjs << 3);
  __dest_00 = malloc((long)p->nObjs << 3);
  __dest_01 = malloc((long)p->nObjs << 3);
  memcpy(__dest,p->pTimes,(long)p->nObjs << 3);
  memcpy(__dest_00,p->pSlews,(long)p->nObjs << 3);
  memcpy(__dest_01,p->pLoads,(long)p->nObjs << 3);
  Abc_SclTimeNtkRecompute(p,(float *)0x0,(float *)0x0,0,0.0);
  for (pObj._0_4_ = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), (int)(uint)pObj < iVar1;
      pObj._0_4_ = (uint)pObj + 1) {
    pObj_00 = Abc_NtkObj(pNtk,(uint)pObj);
    if ((pObj_00 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pObj_00), iVar1 != 0)) {
      fVar2 = Abc_AbsFloat(p->pLoads[(int)(uint)pObj].rise -
                           *(float *)((long)__dest_01 + (long)(int)(uint)pObj * 8));
      if (0.001 < fVar2) {
        printf("%6d : load rise differs %12.6f   %f %f\n",
               (double)(p->pLoads[(int)(uint)pObj].rise -
                       *(float *)((long)__dest_01 + (long)(int)(uint)pObj * 8)),
               (double)p->pLoads[(int)(uint)pObj].rise,
               (double)*(float *)((long)__dest_01 + (long)(int)(uint)pObj * 8),(ulong)(uint)pObj);
      }
      fVar2 = Abc_AbsFloat(p->pLoads[(int)(uint)pObj].fall -
                           *(float *)((long)__dest_01 + (long)(int)(uint)pObj * 8 + 4));
      if (0.001 < fVar2) {
        printf("%6d : load fall differs %12.6f   %f %f\n",
               (double)(p->pLoads[(int)(uint)pObj].fall -
                       *(float *)((long)__dest_01 + (long)(int)(uint)pObj * 8 + 4)),
               (double)p->pLoads[(int)(uint)pObj].fall,
               (double)*(float *)((long)__dest_01 + (long)(int)(uint)pObj * 8 + 4),(ulong)(uint)pObj
              );
      }
      fVar2 = Abc_AbsFloat(p->pSlews[(int)(uint)pObj].rise -
                           *(float *)((long)__dest_00 + (long)(int)(uint)pObj * 8));
      if (0.001 < fVar2) {
        printf("%6d : slew rise differs %12.6f   %f %f\n",
               (double)(p->pSlews[(int)(uint)pObj].rise -
                       *(float *)((long)__dest_00 + (long)(int)(uint)pObj * 8)),
               (double)p->pSlews[(int)(uint)pObj].rise,
               (double)*(float *)((long)__dest_00 + (long)(int)(uint)pObj * 8),(ulong)(uint)pObj);
      }
      fVar2 = Abc_AbsFloat(p->pSlews[(int)(uint)pObj].fall -
                           *(float *)((long)__dest_00 + (long)(int)(uint)pObj * 8 + 4));
      if (0.001 < fVar2) {
        printf("%6d : slew fall differs %12.6f   %f %f\n",
               (double)(p->pSlews[(int)(uint)pObj].fall -
                       *(float *)((long)__dest_00 + (long)(int)(uint)pObj * 8 + 4)),
               (double)p->pSlews[(int)(uint)pObj].fall,
               (double)*(float *)((long)__dest_00 + (long)(int)(uint)pObj * 8 + 4),(ulong)(uint)pObj
              );
      }
      fVar2 = Abc_AbsFloat(p->pTimes[(int)(uint)pObj].rise -
                           *(float *)((long)__dest + (long)(int)(uint)pObj * 8));
      if (0.001 < fVar2) {
        printf("%6d : time rise differs %12.6f   %f %f\n",
               (double)(p->pTimes[(int)(uint)pObj].rise -
                       *(float *)((long)__dest + (long)(int)(uint)pObj * 8)),
               (double)p->pTimes[(int)(uint)pObj].rise,
               (double)*(float *)((long)__dest + (long)(int)(uint)pObj * 8),(ulong)(uint)pObj);
      }
      fVar2 = Abc_AbsFloat(p->pTimes[(int)(uint)pObj].fall -
                           *(float *)((long)__dest + (long)(int)(uint)pObj * 8 + 4));
      if (0.001 < fVar2) {
        printf("%6d : time fall differs %12.6f   %f %f\n",
               (double)(p->pTimes[(int)(uint)pObj].fall -
                       *(float *)((long)__dest + (long)(int)(uint)pObj * 8 + 4)),
               (double)p->pTimes[(int)(uint)pObj].fall,
               (double)*(float *)((long)__dest + (long)(int)(uint)pObj * 8 + 4),(ulong)(uint)pObj);
      }
    }
  }
  if (__dest != (void *)0x0) {
    free(__dest);
  }
  if (__dest_00 != (void *)0x0) {
    free(__dest_00);
  }
  if (__dest_01 != (void *)0x0) {
    free(__dest_01);
  }
  return;
}

Assistant:

void Abc_SclUpsizePrintDiffs( SC_Man * p, SC_Lib * pLib, Abc_Ntk_t * pNtk )
{
    float fDiff = (float)0.001;
    int k;
    Abc_Obj_t * pObj;

    SC_Pair * pTimes = ABC_ALLOC( SC_Pair, p->nObjs );
    SC_Pair * pSlews = ABC_ALLOC( SC_Pair, p->nObjs );
    SC_Pair * pLoads = ABC_ALLOC( SC_Pair, p->nObjs );

    memcpy( pTimes, p->pTimes, sizeof(SC_Pair) * p->nObjs );
    memcpy( pSlews, p->pSlews, sizeof(SC_Pair) * p->nObjs );
    memcpy( pLoads, p->pLoads, sizeof(SC_Pair) * p->nObjs );

    Abc_SclTimeNtkRecompute( p, NULL, NULL, 0, 0 );

    Abc_NtkForEachNode( pNtk, pObj, k )
    {
        if ( Abc_AbsFloat(p->pLoads[k].rise - pLoads[k].rise) > fDiff )
            printf( "%6d : load rise differs %12.6f   %f %f\n", k, p->pLoads[k].rise-pLoads[k].rise, p->pLoads[k].rise, pLoads[k].rise );
        if ( Abc_AbsFloat(p->pLoads[k].fall - pLoads[k].fall) > fDiff )
            printf( "%6d : load fall differs %12.6f   %f %f\n", k, p->pLoads[k].fall-pLoads[k].fall, p->pLoads[k].fall, pLoads[k].fall );

        if ( Abc_AbsFloat(p->pSlews[k].rise - pSlews[k].rise) > fDiff )
            printf( "%6d : slew rise differs %12.6f   %f %f\n", k, p->pSlews[k].rise-pSlews[k].rise, p->pSlews[k].rise, pSlews[k].rise );
        if ( Abc_AbsFloat(p->pSlews[k].fall - pSlews[k].fall) > fDiff )
            printf( "%6d : slew fall differs %12.6f   %f %f\n", k, p->pSlews[k].fall-pSlews[k].fall, p->pSlews[k].fall, pSlews[k].fall );

        if ( Abc_AbsFloat(p->pTimes[k].rise - pTimes[k].rise) > fDiff )
            printf( "%6d : time rise differs %12.6f   %f %f\n", k, p->pTimes[k].rise-pTimes[k].rise, p->pTimes[k].rise, pTimes[k].rise );
        if ( Abc_AbsFloat(p->pTimes[k].fall - pTimes[k].fall) > fDiff )
            printf( "%6d : time fall differs %12.6f   %f %f\n", k, p->pTimes[k].fall-pTimes[k].fall, p->pTimes[k].fall, pTimes[k].fall );
    }

/*
if ( memcmp( pTimes, p->pTimes, sizeof(SC_Pair) * p->nObjs ) )
    printf( "Times differ!\n" );
if ( memcmp( pSlews, p->pSlews, sizeof(SC_Pair) * p->nObjs ) )
    printf( "Slews differ!\n" );
if ( memcmp( pLoads, p->pLoads, sizeof(SC_Pair) * p->nObjs ) )
    printf( "Loads differ!\n" );
*/

    ABC_FREE( pTimes );
    ABC_FREE( pSlews );
    ABC_FREE( pLoads );
}